

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

shared_ptr<kratos::IfStmt> __thiscall
kratos::RemoveEmptyBlockVisitor::process
          (RemoveEmptyBlockVisitor *this,shared_ptr<kratos::IfStmt> *stmt)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  IfStmt *pIVar2;
  long lVar3;
  Var *this_01;
  Expr *pEVar4;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  shared_ptr<kratos::StmtBlock> sVar6;
  shared_ptr<kratos::IfStmt> sVar7;
  undefined1 local_88 [8];
  shared_ptr<kratos::StmtBlock> then_body;
  shared_ptr<kratos::StmtBlock> else_body;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined1 local_41;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RDX + 0xe8);
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_50 = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        goto LAB_00217d93;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
LAB_00217d93:
  process((RemoveEmptyBlockVisitor *)local_88,(shared_ptr<kratos::StmtBlock> *)stmt);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RDX + 0xf8);
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar6 = process((RemoveEmptyBlockVisitor *)
                  &then_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,(shared_ptr<kratos::StmtBlock> *)stmt);
  _Var5 = sVar6.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    _Var5._M_pi = extraout_RDX;
  }
  if (local_88 == (undefined1  [8])0x0) {
    if (then_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[0xc]._vptr__Sp_counted_base ==
        *(_func_int ***)
         &then_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[0xc]._M_use_count) {
      (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)0x0;
      *(undefined8 *)&(this->super_IRVisitor).level = 0;
    }
    else {
      this_01 = *(Var **)(*in_RDX + 0xc0);
      p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RDX + 200);
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      pEVar4 = Var::operator~(this_01);
      pIVar2 = (IfStmt *)*in_RDX;
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &(pEVar4->super_Var).super_enable_shared_from_this<kratos::Var>);
      IfStmt::set_predicate(pIVar2,(shared_ptr<kratos::Var> *)&stack0xffffffffffffffc0);
      if ((pointer)local_38._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      pIVar2 = (IfStmt *)*in_RDX;
      Stmt::as<kratos::ScopedStmtBlock>((Stmt *)&stack0xffffffffffffffc0);
      IfStmt::set_then(pIVar2,(shared_ptr<kratos::ScopedStmtBlock> *)&stack0xffffffffffffffc0);
      if ((pointer)local_38._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      pIVar2 = (IfStmt *)*in_RDX;
      std::__shared_ptr<kratos::ScopedStmtBlock,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<kratos::ScopedStmtBlock>>
                ((__shared_ptr<kratos::ScopedStmtBlock,(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffffc0,(allocator<kratos::ScopedStmtBlock> *)&local_41);
      IfStmt::set_else(pIVar2,(shared_ptr<kratos::ScopedStmtBlock> *)&stack0xffffffffffffffc0);
      _Var5._M_pi = extraout_RDX_05;
      if ((pointer)local_38._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        _Var5._M_pi = extraout_RDX_06;
      }
      (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)*in_RDX;
      lVar3 = in_RDX[1];
      in_RDX[1] = 0;
      *(long *)&(this->super_IRVisitor).level = lVar3;
      *in_RDX = 0;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        _Var5._M_pi = extraout_RDX_07;
      }
    }
  }
  else {
    pIVar2 = (IfStmt *)*in_RDX;
    Stmt::as<kratos::ScopedStmtBlock>((Stmt *)&stack0xffffffffffffffc0);
    IfStmt::set_then(pIVar2,(shared_ptr<kratos::ScopedStmtBlock> *)&stack0xffffffffffffffc0);
    _Var5._M_pi = extraout_RDX_00;
    if ((pointer)local_38._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      _Var5._M_pi = extraout_RDX_01;
    }
    (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)*in_RDX;
    lVar3 = in_RDX[1];
    in_RDX[1] = 0;
    *(long *)&(this->super_IRVisitor).level = lVar3;
    *in_RDX = 0;
  }
  if (else_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               else_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    _Var5._M_pi = extraout_RDX_02;
  }
  if (then_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               then_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    _Var5._M_pi = extraout_RDX_03;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var5._M_pi = extraout_RDX_04;
  }
  sVar7.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar7.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<kratos::IfStmt>)
         sVar7.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IfStmt> process(std::shared_ptr<IfStmt> stmt) {
        auto then_ = stmt->then_body();
        auto then_body = process(then_);
        auto else_body = process(stmt->else_body());
        if (!then_body) {
            // then is empty
            if (else_body->empty()) {
                return nullptr;
            } else {
                // invert the condition and make else then
                auto cond = stmt->predicate();
                auto& new_cond = ~(*cond);
                stmt->set_predicate(new_cond.shared_from_this());
                stmt->set_then(else_body->as<ScopedStmtBlock>());
                stmt->set_else(std::make_shared<ScopedStmtBlock>());
                return stmt;
            }
        }
        stmt->set_then(then_body->as<ScopedStmtBlock>());
        return stmt;
    }